

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# USBTypes.cpp
# Opt level: O3

void __thiscall USBSignalState::AddFrame(USBSignalState *this,USBAnalyzerResults *res)

{
  U64 local_48;
  U64 UStack_40;
  ulong local_38;
  undefined8 local_30;
  undefined1 local_28;
  
  Frame::Frame((Frame *)&local_48);
  local_48 = this->mSampleBegin;
  UStack_40 = this->mSampleEnd;
  local_28 = 0;
  local_38 = (ulong)this->mState;
  local_30 = 0;
  AnalyzerResults::AddFrame((Frame *)res);
  AnalyzerResults::CommitResults();
  Frame::~Frame((Frame *)&local_48);
  return;
}

Assistant:

void USBSignalState::AddFrame( USBAnalyzerResults* res )
{
    Frame f;
    f.mStartingSampleInclusive = mSampleBegin;
    f.mEndingSampleInclusive = mSampleEnd;
    f.mType = FT_Signal;
    f.mData1 = mState;
    f.mData2 = 0;

    res->AddFrame( f );
    res->CommitResults();
}